

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O1

void cmFortranModuleAppendUpperLower(string *mod,string *mod_upper,string *mod_lower)

{
  ulong uVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  size_t len;
  long *local_a8;
  long local_98;
  long lStack_90;
  long *local_88 [2];
  long local_78 [2];
  string local_68;
  string local_48;
  
  uVar1 = mod->_M_string_length;
  if (((uVar1 < 4) || (iVar2 = strcmp((mod->_M_dataplus)._M_p + (uVar1 - 4),".mod"), iVar2 != 0)) &&
     (4 < uVar1)) {
    strcmp((mod->_M_dataplus)._M_p + (uVar1 - 5),".smod");
  }
  std::__cxx11::string::substr((ulong)&local_48,(ulong)mod);
  std::__cxx11::string::substr((ulong)local_88,(ulong)mod);
  cmsys::SystemTools::UpperCase(&local_68,&local_48);
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88[0]);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_98 = *plVar4;
    lStack_90 = plVar3[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar4;
    local_a8 = (long *)*plVar3;
  }
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)mod_upper,(ulong)local_a8);
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_append((char *)mod_lower,(ulong)(mod->_M_dataplus)._M_p);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void cmFortranModuleAppendUpperLower(std::string const& mod,
                                            std::string& mod_upper,
                                            std::string& mod_lower)
{
  std::string::size_type ext_len = 0;
  if (cmHasLiteralSuffix(mod, ".mod")) {
    ext_len = 4;
  } else if (cmHasLiteralSuffix(mod, ".smod")) {
    ext_len = 5;
  }
  std::string const& name = mod.substr(0, mod.size() - ext_len);
  std::string const& ext = mod.substr(mod.size() - ext_len);
  mod_upper += cmSystemTools::UpperCase(name) + ext;
  mod_lower += mod;
}